

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O3

void Cec_ManStartSimInfo(Vec_Ptr_t *vInfo,int nFlops)

{
  void **ppvVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar4 = vInfo->nSize;
  if (1 < iVar4) {
    if (iVar4 < nFlops) {
      __assert_fail("nFlops <= Vec_PtrSize(vInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                    ,0x129,"void Cec_ManStartSimInfo(Vec_Ptr_t *, int)");
    }
    ppvVar1 = vInfo->pArray;
    pvVar2 = ppvVar1[1];
    pvVar3 = *ppvVar1;
    uVar8 = (ulong)(uint)nFlops;
    uVar7 = (uint)((ulong)((long)pvVar2 - (long)pvVar3) >> 2);
    if (0 < nFlops) {
      uVar6 = 0;
      do {
        if ((long)vInfo->nSize <= (long)uVar6) goto LAB_005ac4f5;
        if (0 < (int)uVar7) {
          memset(ppvVar1[uVar6],0,(long)pvVar2 - (long)pvVar3 & 0x3fffffffc);
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
      iVar4 = vInfo->nSize;
    }
    if (nFlops < iVar4) {
      do {
        if (nFlops < 0) goto LAB_005ac4f5;
        if (0 < (int)uVar7) {
          pvVar2 = vInfo->pArray[uVar8];
          uVar6 = 0;
          do {
            uVar5 = Gia_ManRandom(0);
            *(uint *)((long)pvVar2 + uVar6 * 4) = uVar5;
            uVar6 = uVar6 + 1;
          } while ((uVar7 & 0x7fffffff) != uVar6);
          iVar4 = vInfo->nSize;
        }
        uVar8 = uVar8 + 1;
      } while ((int)uVar8 < iVar4);
    }
    return;
  }
LAB_005ac4f5:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Cec_ManStartSimInfo( Vec_Ptr_t * vInfo, int nFlops )
{
    unsigned * pInfo;
    int k, w, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    assert( nFlops <= Vec_PtrSize(vInfo) );
    for ( k = 0; k < nFlops; k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    for ( k = nFlops; k < Vec_PtrSize(vInfo); k++ )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, k );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = Gia_ManRandom( 0 );
    }
}